

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

rrb<int,_false,_6> *
immutable::rrb_details::rrb_head_clone<int,false,6>(rrb<int,_false,_6> *original)

{
  rrb<int,_false,_6> *__dest;
  rrb<int,_false,_6> *clone;
  rrb<int,_false,_6> *original_local;
  
  __dest = (rrb<int,_false,_6> *)malloc(0x28);
  memcpy(__dest,original,0x28);
  ref<immutable::rrb_details::tree_node<int,_false>_>::inc(&__dest->root);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::inc(&__dest->tail);
  return __dest;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_head_clone(const rrb<T, atomic_ref_counting, N>* original)
      {
      rrb<T, atomic_ref_counting, N>* clone = (rrb<T, atomic_ref_counting, N>*)malloc(sizeof(rrb<T, atomic_ref_counting, N>));
      memcpy(clone, original, sizeof(rrb<T, atomic_ref_counting, N>));
      clone->root.inc();
      clone->tail.inc();
      return clone;
      }